

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialBeamANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMaterialBeamANCF::ChMaterialBeamANCF
          (ChMaterialBeamANCF *this,double rho,double E,double nu,double k1,double k2)

{
  ChVector<double> *G;
  ChVector<double> *nu_00;
  double dVar1;
  ChVector<double> local_60;
  ChVector<double> local_48;
  ChVector<double> local_30;
  
  this->m_rho = rho;
  dVar1 = (E * 0.5) / (nu + 1.0);
  local_60.m_data[0] = nu;
  local_60.m_data[1] = nu;
  local_60.m_data[2] = nu;
  local_48.m_data[0] = E;
  local_48.m_data[1] = E;
  local_48.m_data[2] = E;
  local_30.m_data[0] = dVar1;
  local_30.m_data[1] = dVar1;
  local_30.m_data[2] = dVar1;
  Calc_D0_Dv(this,&local_48,&local_60,&local_30,k1,k2);
  G = &local_60;
  local_60.m_data[0] = dVar1;
  local_60.m_data[1] = dVar1;
  local_60.m_data[2] = dVar1;
  local_48.m_data[0] = E;
  local_48.m_data[1] = E;
  local_48.m_data[2] = E;
  Calc_E_eps(this,&local_48,nu_00,G,k1,k2);
  local_60.m_data[0] = nu;
  local_60.m_data[1] = nu;
  local_60.m_data[2] = nu;
  local_48.m_data[0] = E;
  local_48.m_data[1] = E;
  local_48.m_data[2] = E;
  Calc_E_eps_Nu(this,&local_48,&local_60,G);
  return;
}

Assistant:

ChMaterialBeamANCF::ChMaterialBeamANCF(double rho,  // material density
                                       double E,    // Young's modulus
                                       double nu,   // Poisson ratio
                                       double k1,   // Shear correction factor along beam local y axis
                                       double k2    // Shear correction factor along beam local z axis
                                       )
    : m_rho(rho) {
    double G = 0.5 * E / (1 + nu);
    Calc_D0_Dv(ChVector<>(E), ChVector<>(nu), ChVector<>(G), k1, k2);
    Calc_E_eps(ChVector<>(E), ChVector<>(nu), ChVector<>(G), k1, k2);  //(For compatibility with ChElementBeam only)
    Calc_E_eps_Nu(E, nu, G);                                           //(For compatibility with ChElementBeam only)
}